

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::connectionCallback(WebServer *this)

{
  undefined8 this_00;
  uint16_t uVar1;
  int iVar2;
  pointer this_01;
  char *pcVar3;
  element_type *peVar4;
  code *local_118;
  undefined8 local_110;
  type local_108;
  Functor local_b8;
  undefined1 local_98 [8];
  HttpConnPtr httpConn;
  allocator local_55;
  socklen_t local_54;
  undefined1 local_50 [8];
  string from;
  EventLoop *loop;
  int connfd;
  socklen_t len;
  sockaddr_in cliAddr;
  WebServer *this_local;
  
  cliAddr.sin_zero = (uchar  [8])this;
  memset(&connfd,0,0x10);
  loop._4_4_ = 0x10;
  loop._0_4_ = 0;
  while( true ) {
    while( true ) {
      loop._0_4_ = accept(this->listenFd_,(sockaddr *)&connfd,(socklen_t *)((long)&loop + 4));
      if ((int)loop < 1) {
        peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->acceptChannel_);
        Channel::setEvent(peVar4,-0x7fffffff);
        peVar4 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->acceptChannel_);
        Channel::update(peVar4);
        return;
      }
      this_01 = std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::
                operator->(&this->reactorPool_);
      from.field_2._8_8_ = EventLoopThreadPool::getNextLoop(this_01);
      if ((int)loop < 100000) break;
      close((int)loop);
    }
    local_54 = len;
    pcVar3 = inet_ntoa((in_addr)len);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar3,&local_55);
    std::allocator<char>::~allocator((allocator<char> *)&local_55);
    std::__cxx11::string::push_back((char)local_50);
    uVar1 = ntohs(connfd._2_2_);
    std::__cxx11::to_string
              ((string *)
               &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (uint)uVar1);
    std::__cxx11::string::operator+=
              ((string *)local_50,
               (string *)
               &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar2 = setNonBlocking((int)loop);
    if (iVar2 == -1) break;
    setNodelay((int)loop);
    HttpConnPool::getNextConn((HttpConnPool *)local_98);
    this_00 = from.field_2._8_8_;
    local_118 = HttpConn::init;
    local_110 = 0;
    std::
    bind<void(HttpConn::*)(EventLoop*,std::__cxx11::string,int),std::shared_ptr<HttpConn>&,EventLoop*&,std::__cxx11::string,int&>
              (&local_108,(offset_in_HttpConn_to_subr *)&local_118,(shared_ptr<HttpConn> *)local_98,
               (EventLoop **)((long)&from.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (int *)&loop);
    std::function<void()>::
    function<std::_Bind<void(HttpConn::*(std::shared_ptr<HttpConn>,EventLoop*,std::__cxx11::string,int))(EventLoop*,std::__cxx11::string,int)>,void>
              ((function<void()> *)&local_b8,&local_108);
    EventLoop::runInLoop((EventLoop *)this_00,&local_b8);
    std::function<void_()>::~function(&local_b8);
    std::
    _Bind<void_(HttpConn::*(std::shared_ptr<HttpConn>,_EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
    ::~_Bind(&local_108);
    std::shared_ptr<HttpConn>::~shared_ptr((shared_ptr<HttpConn> *)local_98);
    std::__cxx11::string::~string((string *)local_50);
  }
  __assert_fail("setNonBlocking(connfd) != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                ,0x66,"void WebServer::connectionCallback()");
}

Assistant:

void WebServer::connectionCallback() {
    struct sockaddr_in cliAddr;
    memset(&cliAddr, 0, sizeof(struct sockaddr_in));
    socklen_t len = sizeof(cliAddr);
    int connfd = 0;
    while ((connfd = accept(listenFd_, (struct sockaddr*)&cliAddr, &len)) > 0) {
        EventLoop *loop = reactorPool_->getNextLoop();
        
        // LOG << "New connection from " << inet_ntoa(cliAddr.sin_addr) << ":" << ntohs(cliAddr.sin_port);
        
        if(connfd >= MAXFD) {
            close(connfd);
            continue;
        }
        std::string from(inet_ntoa(cliAddr.sin_addr));
        from.push_back(':');
        from += std::to_string(ntohs(cliAddr.sin_port));

        assert(setNonBlocking(connfd) != -1);
        setNodelay(connfd);
        HttpConnPtr httpConn = connPool_.getNextConn();
        loop->runInLoop(std::bind(&HttpConn::init, httpConn, loop, std::move(from), connfd));
    }

    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    acceptChannel_->update();
}